

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O0

ProStringList * __thiscall
ProjectBuilderMakefileGenerator::fixListForOutput(ProjectBuilderMakefileGenerator *this,char *where)

{
  ProjectBuilderMakefileGenerator *in_RDX;
  long in_RSI;
  ProKey *in_RDI;
  long in_FS_OFFSET;
  QMakeProject *this_00;
  ProStringList *l;
  ProStringList local_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMakeProject **)(in_RSI + 0xd8);
  l = local_38;
  ProKey::ProKey((ProKey *)this_00,(char *)in_RDI);
  QMakeProject::values(this_00,in_RDI);
  fixListForOutput(in_RDX,l);
  ProKey::~ProKey((ProKey *)0x1392f6);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (ProStringList *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

ProStringList
ProjectBuilderMakefileGenerator::fixListForOutput(const char *where)
{
    return fixListForOutput(project->values(where));
}